

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O1

void density::swap(consume_operation *i_first,consume_operation *i_second)

{
  bool bVar1;
  mutex_type *pmVar2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar3;
  ControlBlock *pCVar4;
  
  pmVar2 = (i_first->m_lock)._M_device;
  (i_first->m_lock)._M_device = (i_second->m_lock)._M_device;
  (i_second->m_lock)._M_device = pmVar2;
  bVar1 = (i_first->m_lock)._M_owns;
  (i_first->m_lock)._M_owns = (i_second->m_lock)._M_owns;
  (i_second->m_lock)._M_owns = bVar1;
  phVar3 = (i_first->m_consume_operation).m_queue;
  pCVar4 = (i_first->m_consume_operation).m_control;
  (i_first->m_consume_operation).m_control = (ControlBlock *)0x0;
  if (i_first != i_second) {
    (i_first->m_consume_operation).m_queue = (i_second->m_consume_operation).m_queue;
    (i_first->m_consume_operation).m_control = (i_second->m_consume_operation).m_control;
    (i_second->m_consume_operation).m_control = (ControlBlock *)0x0;
  }
  if ((i_second->m_consume_operation).m_control != (ControlBlock *)0x0) {
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit(&i_second->m_consume_operation);
  }
  (i_second->m_consume_operation).m_queue = phVar3;
  (i_second->m_consume_operation).m_control = pCVar4;
  return;
}

Assistant:

void swap(consume_operation & i_first, consume_operation & i_second) noexcept
            {
                std::swap(i_first.m_lock, i_second.m_lock);
                std::swap(i_first.m_consume_operation, i_second.m_consume_operation);
            }